

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

bool __thiscall Js::PolymorphicInlineCache::HasType_Flags(PolymorphicInlineCache *this,Type *type)

{
  Type *pTVar1;
  
  pTVar1 = (Type *)this->inlineCaches[(uint)((ulong)type >> 6) & this->size - 1].u.proto.
                   prototypeObject;
  return pTVar1 == (Type *)((ulong)type | 4) || pTVar1 == type;
}

Assistant:

bool PolymorphicInlineCache::HasType_Flags(const Type * type) const
    {
        uint inlineCacheIndex = GetInlineCacheIndexForType(type);
        return inlineCaches[inlineCacheIndex].HasType_Flags(type);
    }